

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blackboard.cpp
# Opt level: O2

void __thiscall
cali::Blackboard::add(Blackboard *this,cali_id_t key,Entry *value,bool include_in_snapshots)

{
  Entry *pEVar1;
  uint64_t uVar2;
  size_t sVar3;
  ulong uVar4;
  
  sVar3 = find_free_slot(this,key);
  if (this->num_entries - 0x38e < 0xfffffffffffffc02) {
    this->num_skipped = this->num_skipped + 1;
  }
  else {
    this->hashtable[sVar3].key = key;
    uVar2 = (value->m_value).m_v.type_and_size;
    pEVar1 = &this->hashtable[sVar3].value;
    pEVar1->m_node = value->m_node;
    (pEVar1->m_value).m_v.type_and_size = uVar2;
    this->hashtable[sVar3].value.m_value.m_v.value = (value->m_value).m_v.value;
    if (include_in_snapshots) {
      this->toc[sVar3 >> 5] = this->toc[sVar3 >> 5] | 1 << ((byte)sVar3 & 0x1f);
      this->toctoc = this->toctoc | 1 << ((byte)(sVar3 >> 5) & 0x1f);
    }
    uVar4 = this->num_entries + 1;
    this->num_entries = uVar4;
    if (uVar4 <= this->max_num_entries) {
      uVar4 = this->max_num_entries;
    }
    this->max_num_entries = uVar4;
  }
  return;
}

Assistant:

void Blackboard::add(cali_id_t key, const Entry& value, bool include_in_snapshots)
{
    size_t I = find_free_slot(key);

    if (num_entries + (Nmax / 10 + 10) > Nmax) {
        ++num_skipped; // Uh oh, we're full
        return;
    }

    hashtable[I].key   = key;
    hashtable[I].value = value;

    if (include_in_snapshots) {
        toc[I / 32] |= (1 << (I % 32));
        toctoc |= (1 << (I / 32));
    }

    ++num_entries;
    max_num_entries = std::max(num_entries, max_num_entries);
}